

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCDOrderParameter.cpp
# Opt level: O1

void __thiscall OpenMD::SCDOrderParameter::process(SCDOrderParameter *this)

{
  pointer pdVar1;
  int iVar2;
  long lVar3;
  pointer pSVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  RealType RVar8;
  DumpReader reader;
  DumpReader DStack_1288;
  
  DumpReader::DumpReader
            (&DStack_1288,(this->super_StaticAnalyser).info_,
             &(this->super_StaticAnalyser).dumpFilename_);
  iVar2 = DumpReader::getNFrames(&DStack_1288);
  if (0 < iVar2) {
    iVar7 = 0;
    do {
      DumpReader::readFrame(&DStack_1288,iVar7);
      pSVar4 = (this->scdElems_).
               super__Vector_base<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_>._M_impl.
               super__Vector_impl_data._M_start;
      this->currentSnapshot_ = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
      if ((this->scdElems_).super__Vector_base<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_>.
          _M_impl.super__Vector_impl_data._M_finish != pSVar4) {
        lVar5 = 0;
        uVar6 = 0;
        do {
          RVar8 = SCDElem::calcSCD((SCDElem *)((long)&(pSVar4->sele1_)._M_dataplus._M_p + lVar5),
                                   this->currentSnapshot_);
          pdVar1 = (this->scdParam_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar1[uVar6] = RVar8 + pdVar1[uVar6];
          uVar6 = uVar6 + 1;
          pSVar4 = (this->scdElems_).
                   super__Vector_base<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar5 = lVar5 + 0x80;
        } while (uVar6 < (ulong)((long)(this->scdElems_).
                                       super__Vector_base<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar4 >>
                                7));
      }
      iVar7 = iVar7 + (this->super_StaticAnalyser).step_;
    } while (iVar7 < iVar2);
  }
  lVar5 = (long)(this->scdElems_).
                super__Vector_base<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->scdElems_).
                super__Vector_base<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar5 != 0) {
    lVar5 = lVar5 >> 7;
    iVar7 = (this->super_StaticAnalyser).step_;
    pdVar1 = (this->scdParam_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar3 = 0;
    do {
      pdVar1[lVar3] = pdVar1[lVar3] / (double)(iVar2 / iVar7);
      lVar3 = lVar3 + 1;
    } while (lVar5 + (ulong)(lVar5 == 0) != lVar3);
  }
  writeSCD(this);
  DumpReader::~DumpReader(&DStack_1288);
  return;
}

Assistant:

void SCDOrderParameter::process() {
    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();

    for (int i = 0; i < nFrames; i += step_) {
      reader.readFrame(i);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      for (std::size_t j = 0; j < scdElems_.size(); ++j) {
        scdParam_[j] += scdElems_[j].calcSCD(currentSnapshot_);
      }
    }

    int nProcessed = nFrames / step_;
    for (std::size_t j = 0; j < scdElems_.size(); ++j) {
      scdParam_[j] /= nProcessed;
    }

    writeSCD();
  }